

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

bool __thiscall leveldb::Version::UpdateStats(Version *this,GetStats *stats)

{
  int iVar1;
  FileMetaData *pFVar2;
  
  pFVar2 = stats->seek_file;
  if (((pFVar2 != (FileMetaData *)0x0) &&
      (iVar1 = pFVar2->allowed_seeks, pFVar2->allowed_seeks = iVar1 + -1, iVar1 < 2)) &&
     (this->file_to_compact_ == (FileMetaData *)0x0)) {
    this->file_to_compact_ = pFVar2;
    this->file_to_compact_level_ = stats->seek_file_level;
    return true;
  }
  return false;
}

Assistant:

bool Version::UpdateStats(const GetStats& stats) {
  FileMetaData* f = stats.seek_file;
  if (f != nullptr) {
    f->allowed_seeks--;
    if (f->allowed_seeks <= 0 && file_to_compact_ == nullptr) {
      file_to_compact_ = f;
      file_to_compact_level_ = stats.seek_file_level;
      return true;
    }
  }
  return false;
}